

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

bool __thiscall
GlobOpt::OptIsInvariant
          (GlobOpt *this,Instr *instr,BasicBlock *block,Loop *loop,Value *src1Val,Value *src2Val,
          bool isNotTypeSpecConv,bool forceInvariantHoisting)

{
  OpCode OVar1;
  Func *pFVar2;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  Func *pFVar6;
  undefined4 *puVar7;
  PropertySymOpnd *this_00;
  PropertySym *this_01;
  StackSym *sym;
  Value *srcVal;
  Opnd *this_02;
  
  bVar4 = Loop::CanHoistInvariants(loop);
  if (!bVar4) {
    return false;
  }
  bVar4 = OpCodeAttr::CanCSE(instr->m_opcode);
  if (!bVar4) {
    return false;
  }
  bVar4 = OpCodeAttr::OpndHasImplicitCall(instr->m_opcode);
  bVar4 = !bVar4;
  OVar1 = instr->m_opcode;
  if (1 < OVar1 - 0x1e4) {
    if (OVar1 == CheckObjType) {
      this_02 = instr->m_src1;
      if (this_02 == (Opnd *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x3a4c,"(instr->GetSrc1())","instr->GetSrc1()");
        if (!bVar5) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar7 = 0;
        this_02 = instr->m_src1;
      }
      this_00 = IR::Opnd::AsPropertySymOpnd(this_02);
      this_01 = IR::PropertySymOpnd::GetPropertySym(this_00);
      bVar5 = PropertySym::HasObjectTypeSym(this_01);
      if (bVar5) {
        sym = PropertySym::GetObjectTypeSym(this_01);
        srcVal = GlobOptBlockData::FindValue(&this->currentBlock->globOptData,&sym->super_Sym);
        bVar5 = OptIsInvariant(this,&sym->super_Sym,block,loop,srcVal,true,true,(Value **)0x0);
        if (!bVar5) {
          return false;
        }
      }
      goto LAB_00440333;
    }
    if (OVar1 == LdLen_A) {
      return false;
    }
    if (OVar1 == LdArgumentsFromFrame) {
      pFVar2 = instr->m_func;
      pFVar6 = Loop::GetFunc(loop);
      if (pFVar2 != pFVar6) {
        return false;
      }
      goto LAB_00440333;
    }
    if (OVar1 == FromVar) {
      bVar4 = (bool)(bVar4 | (instr->field_0x38 & 0x10) >> 4);
      goto LAB_00440333;
    }
    if (OVar1 == BailOnNotStackArgs) {
      return false;
    }
    if (OVar1 != Ld_A) goto LAB_00440333;
  }
  if (!forceInvariantHoisting) {
    return false;
  }
LAB_00440333:
  if ((instr->m_dst == (Opnd *)0x0) || (bVar5 = IR::Opnd::IsRegOpnd(instr->m_dst), bVar5)) {
    if (instr->m_src1 == (Opnd *)0x0) {
      return true;
    }
    bVar5 = OptIsInvariant(this,instr->m_src1,block,loop,src1Val,isNotTypeSpecConv,bVar4);
    if (bVar5) {
      if (instr->m_src2 == (Opnd *)0x0) {
        return true;
      }
      bVar4 = OptIsInvariant(this,instr->m_src2,block,loop,src2Val,isNotTypeSpecConv,bVar4);
      if (bVar4) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool
GlobOpt::OptIsInvariant(
    IR::Instr *instr,
    BasicBlock *block,
    Loop *loop,
    Value *src1Val,
    Value *src2Val,
    bool isNotTypeSpecConv,
    const bool forceInvariantHoisting)
{
    if (!loop->CanHoistInvariants())
    {
        return false;
    }
    if (!OpCodeAttr::CanCSE(instr->m_opcode))
    {
        return false;
    }

    bool allowNonPrimitives = !OpCodeAttr::OpndHasImplicitCall(instr->m_opcode);

    switch(instr->m_opcode)
    {
        // Can't legally hoist these
    case Js::OpCode::LdLen_A:
        return false;

        //Can't Hoist BailOnNotStackArgs, as it is necessary as InlineArgsOptimization relies on this opcode
        //to decide whether to throw rejit exception or not.
    case Js::OpCode::BailOnNotStackArgs:
        return false;

        // Usually not worth hoisting these
    case Js::OpCode::Ld_A:
    case Js::OpCode::Ld_I4:
    case Js::OpCode::LdC_A_I4:
        if(!forceInvariantHoisting)
        {
            return false;
        }
        break;

        // Can't hoist these outside the function it's for. The LdArgumentsFromFrame for an inlinee depends on the inlinee meta arg
        // that holds the arguments object, which is only initialized at the start of the inlinee. So, can't hoist this outside the
        // inlinee.
    case Js::OpCode::LdArgumentsFromFrame:
        if(instr->m_func != loop->GetFunc())
        {
            return false;
        }
        break;

    case Js::OpCode::FromVar:
        if (instr->HasBailOutInfo())
        {
            allowNonPrimitives = true;
        }
        break;
    case Js::OpCode::CheckObjType:
        // Bug 11712101: If the operand is a field, ensure that its containing object type is invariant
        // before hoisting -- that is, don't hoist a CheckObjType over a DeleteFld on that object.
        // (CheckObjType only checks the operand and its immediate parent, so we don't need to go
        // any farther up the object graph.)
        Assert(instr->GetSrc1());
        PropertySym *propertySym = instr->GetSrc1()->AsPropertySymOpnd()->GetPropertySym();
        if (propertySym->HasObjectTypeSym()) {
            StackSym *objectTypeSym = propertySym->GetObjectTypeSym();
            if (!this->OptIsInvariant(objectTypeSym, block, loop, this->CurrentBlockData()->FindValue(objectTypeSym), true, true)) {
                return false;
            }
        }

        break;
    }

    IR::Opnd *dst = instr->GetDst();

    if (dst && !dst->IsRegOpnd())
    {
        return false;
    }

    IR::Opnd *src1 = instr->GetSrc1();

    if (src1)
    {
        if (!this->OptIsInvariant(src1, block, loop, src1Val, isNotTypeSpecConv, allowNonPrimitives))
        {
            return false;
        }

        IR::Opnd *src2 = instr->GetSrc2();

        if (src2)
        {
            if (!this->OptIsInvariant(src2, block, loop, src2Val, isNotTypeSpecConv, allowNonPrimitives))
            {
                return false;
            }
        }
    }

    return true;
}